

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O0

uint __thiscall Assimp::FBX::MeshGeometry::FaceForVertexIndex(MeshGeometry *this,uint in_index)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  iterator iVar4;
  iterator __last;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last_00;
  difference_type dVar5;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_48;
  iterator it;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_38;
  uint *local_30;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_28;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_20;
  value_type_conflict1 local_18;
  uint local_14;
  MeshGeometry *pMStack_10;
  uint in_index_local;
  MeshGeometry *this_local;
  
  local_14 = in_index;
  pMStack_10 = this;
  sVar2 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                    (&this->m_vertices);
  if (sVar2 <= in_index) {
    __assert_fail("in_index < m_vertices.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXMeshGeometry.cpp"
                  ,0x101,
                  "unsigned int Assimp::FBX::MeshGeometry::FaceForVertexIndex(unsigned int) const");
  }
  bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                    (&this->m_facesVertexStartIndices);
  if (bVar1) {
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_faces);
    local_18 = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->m_facesVertexStartIndices,sVar2 + 1,&local_18);
    local_20._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->m_faces);
    local_28._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&this->m_faces);
    local_38._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           (&this->m_facesVertexStartIndices);
    local_30 = (uint *)__gnu_cxx::
                       __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                       ::operator+(&local_38,1);
    it._M_current =
         (uint *)std::
                 partial_sum<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                           (local_20,local_28,
                            (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                             )local_30);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back
              (&this->m_facesVertexStartIndices);
  }
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    (&this->m_facesVertexStartIndices);
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_faces);
  if (sVar2 != sVar3) {
    __assert_fail("m_facesVertexStartIndices.size() == m_faces.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXMeshGeometry.cpp"
                  ,0x10c,
                  "unsigned int Assimp::FBX::MeshGeometry::FaceForVertexIndex(unsigned int) const");
  }
  iVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                    (&this->m_facesVertexStartIndices);
  __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                     (&this->m_facesVertexStartIndices);
  local_48 = std::
             upper_bound<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
                       (iVar4._M_current,__last._M_current,&local_14);
  iVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                    (&this->m_facesVertexStartIndices);
  __last_00 = __gnu_cxx::
              __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator-(&local_48,1);
  dVar5 = std::
          distance<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                    ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      )iVar4._M_current,__last_00);
  return (uint)dVar5;
}

Assistant:

unsigned int MeshGeometry::FaceForVertexIndex( unsigned int in_index ) const {
    ai_assert( in_index < m_vertices.size() );

    // in the current conversion pattern this will only be needed if
    // weights are present, so no need to always pre-compute this table
    if ( m_facesVertexStartIndices.empty() ) {
        m_facesVertexStartIndices.resize( m_faces.size() + 1, 0 );

        std::partial_sum( m_faces.begin(), m_faces.end(), m_facesVertexStartIndices.begin() + 1 );
        m_facesVertexStartIndices.pop_back();
    }

    ai_assert( m_facesVertexStartIndices.size() == m_faces.size() );
    const std::vector<unsigned int>::iterator it = std::upper_bound(
        m_facesVertexStartIndices.begin(),
        m_facesVertexStartIndices.end(),
        in_index
        );

    return static_cast< unsigned int >( std::distance( m_facesVertexStartIndices.begin(), it - 1 ) );
}